

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenlibClientSubscription.c
# Opt level: O0

GenlibClientSubscription * GenlibClientSubscription_new(void)

{
  UpnpString *pUVar1;
  s_GenlibClientSubscription *p;
  
  p = (s_GenlibClientSubscription *)calloc(1,0x28);
  if (p == (s_GenlibClientSubscription *)0x0) {
    p = (s_GenlibClientSubscription *)0x0;
  }
  else {
    pUVar1 = UpnpString_new();
    p->m_SID = pUVar1;
    pUVar1 = UpnpString_new();
    p->m_ActualSID = pUVar1;
    pUVar1 = UpnpString_new();
    p->m_EventURL = pUVar1;
  }
  return p;
}

Assistant:

GenlibClientSubscription *GenlibClientSubscription_new(void)
{
	struct s_GenlibClientSubscription *p =
		calloc(1, sizeof(struct s_GenlibClientSubscription));

	if (!p)
		return 0;

	/*p->m_RenewEventId = 0;*/
	p->m_SID = UpnpString_new();
	p->m_ActualSID = UpnpString_new();
	p->m_EventURL = UpnpString_new();
	/*p->m_Next = 0;*/

	return (GenlibClientSubscription *)p;
}